

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void cmAddLinkDirectoryForTarget(void *arg,char *tgt,char *d)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,tgt,&local_51);
  std::__cxx11::string::string((string *)&local_50,d,&local_52);
  cmMakefile::AddLinkDirectoryForTarget((cmMakefile *)arg,&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CCONV cmAddLinkDirectoryForTarget(void *arg, const char *tgt,
  const char* d)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  mf->AddLinkDirectoryForTarget(tgt,d);
}